

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprIdToTrueFalse(Expr *pExpr)

{
  char *zLeft;
  int iVar1;
  
  zLeft = (pExpr->u).zToken;
  iVar1 = sqlite3StrICmp(zLeft,"true");
  if ((iVar1 != 0) && (iVar1 = sqlite3StrICmp(zLeft,"false"), iVar1 != 0)) {
    return 0;
  }
  pExpr->op = 0x9b;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIdToTrueFalse(Expr *pExpr){
  assert( pExpr->op==TK_ID || pExpr->op==TK_STRING );
  if( sqlite3StrICmp(pExpr->u.zToken, "true")==0
   || sqlite3StrICmp(pExpr->u.zToken, "false")==0
  ){
    pExpr->op = TK_TRUEFALSE;
    return 1;
  }
  return 0;
}